

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

CBan<CNetRange> * __thiscall
CNetBan::CBanPool<CNetRange,_16>::Add
          (CBanPool<CNetRange,_16> *this,CDataType *pData,CBanInfo *pInfo,CNetHash *pNetHash)

{
  int iVar1;
  CBan<CNetRange> *pCVar2;
  CBan<CNetRange> *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uint uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  long lVar17;
  CBanInfo *pCVar18;
  CBanInfo *pCVar19;
  CBan<CNetRange> *pCVar20;
  CBan<CNetRange> **ppCVar21;
  
  pCVar2 = this->m_pFirstFree;
  if (pCVar2 != (CBan<CNetRange> *)0x0) {
    uVar12 = (pData->m_LB).type;
    uVar13 = (pData->m_LB).ip[0];
    uVar14 = (pData->m_LB).ip[1];
    uVar15 = (pData->m_LB).ip[2];
    uVar16 = (pData->m_LB).ip[3];
    uVar4 = *(undefined8 *)((pData->m_LB).ip + 4);
    uVar5 = *(undefined8 *)((pData->m_LB).ip + 0xc);
    uVar7 = (pData->m_UB).type;
    uVar8 = (pData->m_UB).ip[0];
    uVar9 = (pData->m_UB).ip[1];
    uVar10 = (pData->m_UB).ip[2];
    uVar11 = (pData->m_UB).ip[3];
    uVar6 = *(undefined8 *)((pData->m_UB).ip + 0xc);
    *(undefined8 *)((pCVar2->m_Data).m_UB.ip + 4) = *(undefined8 *)((pData->m_UB).ip + 4);
    *(undefined8 *)((pCVar2->m_Data).m_UB.ip + 0xc) = uVar6;
    *(undefined8 *)((pCVar2->m_Data).m_LB.ip + 0xc) = uVar5;
    (pCVar2->m_Data).m_UB.type = uVar7;
    (pCVar2->m_Data).m_UB.ip[0] = uVar8;
    (pCVar2->m_Data).m_UB.ip[1] = uVar9;
    (pCVar2->m_Data).m_UB.ip[2] = uVar10;
    (pCVar2->m_Data).m_UB.ip[3] = uVar11;
    (pCVar2->m_Data).m_LB.type = uVar12;
    (pCVar2->m_Data).m_LB.ip[0] = uVar13;
    (pCVar2->m_Data).m_LB.ip[1] = uVar14;
    (pCVar2->m_Data).m_LB.ip[2] = uVar15;
    (pCVar2->m_Data).m_LB.ip[3] = uVar16;
    *(undefined8 *)((pCVar2->m_Data).m_LB.ip + 4) = uVar4;
    pCVar18 = pInfo;
    pCVar19 = &pCVar2->m_Info;
    for (lVar17 = 0x12; lVar17 != 0; lVar17 = lVar17 + -1) {
      pCVar19->m_Expires = pCVar18->m_Expires;
      pCVar18 = (CBanInfo *)&pCVar18->m_LastInfoQuery;
      pCVar19 = (CBanInfo *)&pCVar19->m_LastInfoQuery;
    }
    pCVar2->m_NetHash = *pNetHash;
    pCVar3 = pCVar2->m_pNext;
    pCVar20 = pCVar2->m_pPrev;
    if (pCVar3 != (CBan<CNetRange> *)0x0) {
      pCVar3->m_pPrev = pCVar20;
    }
    ppCVar21 = &pCVar20->m_pNext;
    if (pCVar20 == (CBan<CNetRange> *)0x0) {
      ppCVar21 = &this->m_pFirstFree;
    }
    *ppCVar21 = pCVar3;
    ppCVar21 = this->m_paaHashList[pNetHash->m_HashIndex] + pNetHash->m_Hash;
    if (*ppCVar21 != (CBan<CNetRange> *)0x0) {
      (*ppCVar21)->m_pHashPrev = pCVar2;
    }
    pCVar2->m_pHashPrev = (CBan<CNetRange> *)0x0;
    pCVar2->m_pHashNext = *ppCVar21;
    *ppCVar21 = pCVar2;
    pCVar3 = this->m_pFirstUsed;
    if (this->m_pFirstUsed == (CBan<CNetRange> *)0x0) {
      this->m_pFirstUsed = pCVar2;
      pCVar2->m_pNext = (CBan<CNetRange> *)0x0;
      pCVar2->m_pPrev = (CBan<CNetRange> *)0x0;
    }
    else {
      do {
        pCVar20 = pCVar3;
        iVar1 = (pCVar20->m_Info).m_Expires;
        if ((iVar1 == -1) || ((pInfo->m_Expires != -1 && (pInfo->m_Expires <= iVar1)))) {
          pCVar2->m_pNext = pCVar20;
          pCVar3 = pCVar20->m_pPrev;
          pCVar2->m_pPrev = pCVar3;
          ppCVar21 = &pCVar3->m_pNext;
          if (pCVar3 == (CBan<CNetRange> *)0x0) {
            ppCVar21 = &this->m_pFirstUsed;
          }
          *ppCVar21 = pCVar2;
          pCVar20->m_pPrev = pCVar2;
          goto LAB_001c610a;
        }
        pCVar3 = pCVar20->m_pNext;
      } while (pCVar20->m_pNext != (CBan<CNetRange> *)0x0);
      pCVar20->m_pNext = pCVar2;
      pCVar2->m_pPrev = pCVar20;
      pCVar2->m_pNext = (CBan<CNetRange> *)0x0;
    }
LAB_001c610a:
    this->m_CountUsed = this->m_CountUsed + 1;
  }
  return pCVar2;
}

Assistant:

typename CNetBan::CBan<T> *CNetBan::CBanPool<T, HashCount>::Add(const T *pData, const CBanInfo *pInfo,  const CNetHash *pNetHash)
{
	if(!m_pFirstFree)
		return 0;

	// create new ban
	CBan<T> *pBan = m_pFirstFree;
	pBan->m_Data = *pData;
	pBan->m_Info = *pInfo;
	pBan->m_NetHash = *pNetHash;
	if(pBan->m_pNext)
		pBan->m_pNext->m_pPrev = pBan->m_pPrev;
	if(pBan->m_pPrev)
		pBan->m_pPrev->m_pNext = pBan->m_pNext;
	else
		m_pFirstFree = pBan->m_pNext;

	// add it to the hash list
	if(m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash])
		m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash]->m_pHashPrev = pBan;
	pBan->m_pHashPrev = 0;
	pBan->m_pHashNext = m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash];
	m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash] = pBan;

	// insert it into the used list
	if(m_pFirstUsed)
	{
		for(CBan<T> *p = m_pFirstUsed; ; p = p->m_pNext)
		{
			if(p->m_Info.m_Expires == CBanInfo::EXPIRES_NEVER || (pInfo->m_Expires != CBanInfo::EXPIRES_NEVER && pInfo->m_Expires <= p->m_Info.m_Expires))
			{
				// insert before
				pBan->m_pNext = p;
				pBan->m_pPrev = p->m_pPrev;
				if(p->m_pPrev)
					p->m_pPrev->m_pNext = pBan;
				else
					m_pFirstUsed = pBan;
				p->m_pPrev = pBan;
				break;
			}

			if(!p->m_pNext)
			{
				// last entry
				p->m_pNext = pBan;
				pBan->m_pPrev = p;
				pBan->m_pNext = 0;
				break;
			}
		}
	}
	else
	{
		m_pFirstUsed = pBan;
		pBan->m_pNext = pBan->m_pPrev = 0;
	}

	// update ban count
	++m_CountUsed;

	return pBan;
}